

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSA.cpp
# Opt level: O3

void __thiscall Storage::Disk::MSA::MSA(MSA *this,string *file_name)

{
  FileHolder *this_00;
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  __ino_t _Var4;
  long lVar5;
  undefined4 *puVar6;
  size_t in_RCX;
  ushort uVar7;
  uint8_t value;
  uint8_t byte;
  vector<unsigned_char,_std::allocator<unsigned_char>_> track;
  uint8_t local_6a;
  uint8_t local_69;
  FILE *local_68;
  iterator iStack_60;
  uchar *local_58;
  undefined8 local_48;
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  *local_40;
  __ino_t local_38;
  
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__MSA_005a2750;
  this_00 = &this->file_;
  FileHolder::FileHolder(this_00,file_name,ReadWrite);
  local_40 = (vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&this->uncompressed_tracks_;
  (this->uncompressed_tracks_).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->uncompressed_tracks_).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uncompressed_tracks_).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = FileHolder::get16be(this_00);
  if (uVar2 == 0xe0f) {
    uVar2 = FileHolder::get16be(this_00);
    this->sectors_per_track_ = uVar2;
    uVar2 = FileHolder::get16be(this_00);
    this->sides_ = uVar2 + 1;
    uVar2 = FileHolder::get16be(this_00);
    this->starting_track_ = uVar2;
    uVar2 = FileHolder::get16be(this_00);
    this->ending_track_ = uVar2;
    local_48 = this;
    while( true ) {
      uVar2 = FileHolder::get16be(this_00);
      bVar1 = FileHolder::eof(this_00);
      if (bVar1) break;
      if ((uint)*(uint16_t *)(local_48 + 0xf0) << 9 == (uint)uVar2) {
        FileHolder::read((FileHolder *)&stack0xffffffffffffff98,(int)this_00,(void *)(ulong)uVar2,
                         in_RCX);
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (local_40,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &stack0xffffffffffffff98);
      }
      else {
        _Var4 = FileHolder::tell(this_00);
        local_68 = (FILE *)0x0;
        iStack_60._M_current = (uchar *)0x0;
        local_58 = (uchar *)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffff98
                   ,(ulong)*(uint16_t *)(local_48 + 0xf0) << 9);
        uVar7 = 0;
        local_38 = _Var4;
        if (uVar2 != 0) {
          do {
            local_69 = FileHolder::get8(this_00);
            if (local_69 == 0xe5) {
              uVar7 = uVar7 + 4;
              if (uVar2 < uVar7) break;
              local_6a = FileHolder::get8(this_00);
              for (uVar3 = FileHolder::get16be(this_00); uVar3 != 0; uVar3 = uVar3 - 1) {
                if (iStack_60._M_current == local_58) {
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  _M_realloc_insert<unsigned_char_const&>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                             &stack0xffffffffffffff98,iStack_60,&local_6a);
                }
                else {
                  *iStack_60._M_current = local_6a;
                  iStack_60._M_current = iStack_60._M_current + 1;
                }
              }
            }
            else {
              if (iStack_60._M_current == local_58) {
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_realloc_insert<unsigned_char_const&>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                           &stack0xffffffffffffff98,iStack_60,&local_69);
              }
              else {
                *iStack_60._M_current = local_69;
                iStack_60._M_current = iStack_60._M_current + 1;
              }
              uVar7 = uVar7 + 1;
            }
          } while (uVar7 < uVar2);
        }
        lVar5 = FileHolder::tell(this_00);
        if (lVar5 - local_38 != (ulong)uVar7) {
          __assert_fail("file_.tell() - start_of_track == pointer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/DiskImage/Formats/MSA.cpp"
                        ,0x41,"Storage::Disk::MSA::MSA(const std::string &)");
        }
        if ((uVar7 != uVar2) ||
           (in_RCX = (ulong)*(uint16_t *)(local_48 + 0xf0) * 0x200,
           (long)iStack_60._M_current - (long)local_68 != in_RCX)) {
          puVar6 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar6 = 0xfffffffe;
          __cxa_throw(puVar6,&Error::typeinfo,0);
        }
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (local_40,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &stack0xffffffffffffff98);
      }
      if (local_68 != (FILE *)0x0) {
        operator_delete(local_68,(long)local_58 - (long)local_68);
      }
    }
    if (((long)*(pointer *)(local_48 + 0x100) -
         (long)(((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)(local_48 + 0xf8))->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
        (long)(int)((uint)*(uint16_t *)(local_48 + 0xf2) *
                   (((uint)*(uint16_t *)(local_48 + 0xf6) - (uint)*(uint16_t *)(local_48 + 0xf4)) +
                   1)) == 0) {
      return;
    }
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 0xfffffffe;
  __cxa_throw(puVar6,&Error::typeinfo,0);
}

Assistant:

MSA::MSA(const std::string &file_name) :
	file_(file_name) {
	const auto signature = file_.get16be();
	if(signature != 0x0e0f) throw Error::InvalidFormat;

	sectors_per_track_ = file_.get16be();
	sides_ = 1 + file_.get16be();
	starting_track_ = file_.get16be();
	ending_track_ = file_.get16be();

	// Create the uncompressed track list.
	while(true) {
		const auto data_length = file_.get16be();
		if(file_.eof()) break;

		if(data_length == sectors_per_track_ * 512) {
			// This is an uncompressed track.
			uncompressed_tracks_.push_back(file_.read(data_length));
		} else {
#ifndef NDEBUG
			const auto start_of_track = file_.tell();
#endif
			// This is an RLE-compressed track.
			std::vector<uint8_t> track;
			track.reserve(sectors_per_track_ * 512);
			uint16_t pointer = 0;
			while(pointer < data_length) {
				const auto byte = file_.get8();

				// Compression scheme: if the byte E5 is encountered, an RLE run follows.
				// An RLE run is encoded as the byte to repeat plus a 16-bit repeat count.
				if(byte != 0xe5) {
					track.push_back(byte);
					++pointer;
					continue;
				}

				pointer += 4;
				if(pointer > data_length) break;

				const auto value = file_.get8();
				auto count = file_.get16be();
				while(count--) {
					track.push_back(value);
				}
			}

#ifndef NDEBUG
			assert(file_.tell() - start_of_track == pointer);
#endif

			if(pointer != data_length || track.size() != sectors_per_track_ * 512)
				throw Error::InvalidFormat;
			uncompressed_tracks_.push_back(std::move(track));
		}
	}

	if(uncompressed_tracks_.size() != size_t((ending_track_ - starting_track_ + 1)*sides_))
		throw Error::InvalidFormat;
}